

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::createConditionalBranch(Builder *this,Id condition,Block *thenBlock,Block *elseBlock)

{
  Vector<Id> *this_00;
  Block *pBVar1;
  Block *this_01;
  Instruction *instruction;
  uint *puVar2;
  iterator iVar3;
  Instruction *raw_instruction;
  Id local_4c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  Block *local_40;
  Block *local_38;
  
  local_38 = elseBlock;
  instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = 0;
  instruction->typeId = 0;
  instruction->opCode = OpBranchConditional;
  this_00 = &instruction->operands;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  local_4c = condition;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
             (iterator)0x0,&local_4c);
  iVar3._M_current =
       (instruction->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar2 = (instruction->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_4c = *(uint *)((long)(((thenBlock->instructions).
                               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t + 8);
  local_40 = thenBlock;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar3,
               &local_4c);
    iVar3._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar2 = (instruction->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = local_4c;
    iVar3._M_current = iVar3._M_current + 1;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  this_01 = local_38;
  local_4c = *(uint *)((long)(((local_38->instructions).
                               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t + 8);
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar3,
               &local_4c);
  }
  else {
    *iVar3._M_current = local_4c;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pBVar1 = this->buildPoint;
  local_48._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  instruction->block = pBVar1;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar1->parent->parent,instruction);
  }
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  local_48._M_head_impl = (Instruction *)0x0;
  Block::addPredecessor(local_40,this->buildPoint);
  Block::addPredecessor(this_01,this->buildPoint);
  return;
}

Assistant:

void Builder::createConditionalBranch(Id condition, Block* thenBlock, Block* elseBlock)
{
    Instruction* branch = new Instruction(OpBranchConditional);
    branch->addIdOperand(condition);
    branch->addIdOperand(thenBlock->getId());
    branch->addIdOperand(elseBlock->getId());
    buildPoint->addInstruction(std::unique_ptr<Instruction>(branch));
    thenBlock->addPredecessor(buildPoint);
    elseBlock->addPredecessor(buildPoint);
}